

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

LegacyScriptPubKeyMan * wallet::EnsureLegacyScriptPubKeyMan(CWallet *wallet,bool also_create)

{
  LegacyScriptPubKeyMan *pLVar1;
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  allocator<char> local_41;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar1 = CWallet::GetLegacyScriptPubKeyMan(wallet);
  if (pLVar1 == (LegacyScriptPubKeyMan *)0x0 && also_create) {
    pLVar1 = CWallet::GetOrCreateLegacyScriptPubKeyMan(wallet);
  }
  if (pLVar1 == (LegacyScriptPubKeyMan *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Only legacy wallets are supported by this command",&local_41);
    JSONRPCError(__return_storage_ptr__,-4,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pLVar1;
  }
  __stack_chk_fail();
}

Assistant:

LegacyScriptPubKeyMan& EnsureLegacyScriptPubKeyMan(CWallet& wallet, bool also_create)
{
    LegacyScriptPubKeyMan* spk_man = wallet.GetLegacyScriptPubKeyMan();
    if (!spk_man && also_create) {
        spk_man = wallet.GetOrCreateLegacyScriptPubKeyMan();
    }
    if (!spk_man) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Only legacy wallets are supported by this command");
    }
    return *spk_man;
}